

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_draw_mesh(rf_mesh mesh,rf_material material,rf_mat transform)

{
  _func_void_int_int_uchar_float_ptr *p_Var1;
  rf_shader shader;
  rf_shader shader_00;
  rf_shader shader_01;
  rf_mat left;
  rf_mat rVar2;
  rf_mat mat;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  rf_mat mat_00;
  undefined1 auVar31 [56];
  long lVar32;
  uint **ppuVar33;
  uint **ppuVar34;
  undefined8 *puVar35;
  byte bVar36;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 uVar37;
  undefined8 in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdbc;
  long local_198;
  rf_int i_1;
  rf_mat mat_mvp;
  rf_int i;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  rf_mat mat_model_view;
  rf_mat mat_projection;
  rf_mat mat_view;
  
  rVar2 = transform;
  bVar36 = 0;
  ppuVar34 = &mesh.vbo_id;
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)((uint)mesh.vbo_id);
  if (material.shader.locs[5] != -1) {
    ppuVar33 = ppuVar34;
    puVar35 = (undefined8 *)&stack0xfffffffffffffd38;
    for (lVar32 = 0x10; lVar32 != 0; lVar32 = lVar32 + -1) {
      *puVar35 = *ppuVar33;
      ppuVar33 = ppuVar33 + (ulong)bVar36 * -2 + 1;
      puVar35 = puVar35 + (ulong)bVar36 * -2 + 1;
    }
    mat_00.m8 = transform.m0;
    mat_00.m12 = transform.m4;
    mat_00._0_8_ = material.params;
    mat_00.m1 = transform.m8;
    mat_00.m5 = transform.m12;
    mat_00.m9 = transform.m1;
    mat_00.m13 = transform.m5;
    mat_00.m2 = transform.m9;
    mat_00.m6 = transform.m13;
    mat_00.m10 = transform.m2;
    mat_00.m14 = transform.m6;
    mat_00.m3 = transform.m10;
    mat_00.m7 = transform.m14;
    mat_00.m11 = transform.m3;
    mat_00.m15 = transform.m7;
    shader.locs[1] = (int)in_stack_fffffffffffffd40;
    shader.locs[2] = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
    shader.id = (int)in_stack_fffffffffffffd38;
    shader.locs[0] = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    shader.locs[3] = (int)in_stack_fffffffffffffd48;
    shader.locs[4] = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    shader.locs[5] = (int)in_stack_fffffffffffffd50;
    shader.locs[6] = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    shader.locs[7] = (int)in_stack_fffffffffffffd58;
    shader.locs[8] = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    shader.locs[9] = (int)in_stack_fffffffffffffd60;
    shader.locs[10] = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    shader.locs[0xb] = (int)in_stack_fffffffffffffd68;
    shader.locs[0xc] = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    shader.locs[0xd] = (int)in_stack_fffffffffffffd70;
    shader.locs[0xe] = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    shader.locs[0xf] = (int)in_stack_fffffffffffffd78;
    shader.locs[0x10] = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    shader.locs[0x11] = (int)in_stack_fffffffffffffd80;
    shader.locs[0x12] = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    shader.locs[0x13] = (int)in_stack_fffffffffffffd88;
    shader.locs[0x14] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader.locs[0x15] = (int)in_stack_fffffffffffffd90;
    shader.locs[0x16] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader.locs[0x17] = (int)in_stack_fffffffffffffd98;
    shader.locs[0x18] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader.locs[0x19] = (int)in_stack_fffffffffffffda0;
    shader.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader.locs[0x1b] = (int)in_stack_fffffffffffffda8;
    shader.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader.locs[0x1d] = (int)in_stack_fffffffffffffdb0;
    shader.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader.locs[0x1f] = material.shader.locs[0x1d];
    in_stack_fffffffffffffdb8 = material.shader.locs[0x1d];
    rf_gfx_set_shader_value_matrix(shader,material.shader.locs[5],mat_00);
  }
  if (material.shader.locs[9] != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (material.shader.locs[9],(float)*(byte *)(material._128_8_ + 0x18) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x19) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x1a) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x1b) / 255.0);
  }
  if (material.shader.locs[10] != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (material.shader.locs[10],(float)*(byte *)(material._128_8_ + 0x38) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x39) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x3a) / 255.0,
               (float)*(byte *)(material._128_8_ + 0x3b) / 255.0);
  }
  if (material.shader.locs[6] != -1) {
    ppuVar33 = ppuVar34;
    puVar35 = (undefined8 *)&stack0xfffffffffffffd38;
    for (lVar32 = 0x10; lVar32 != 0; lVar32 = lVar32 + -1) {
      *puVar35 = *ppuVar33;
      ppuVar33 = ppuVar33 + (ulong)bVar36 * -2 + 1;
      puVar35 = puVar35 + (ulong)bVar36 * -2 + 1;
    }
    shader_00.locs[1] = (int)in_stack_fffffffffffffd40;
    shader_00.locs[2] = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
    shader_00.id = (int)in_stack_fffffffffffffd38;
    shader_00.locs[0] = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    shader_00.locs[3] = (int)in_stack_fffffffffffffd48;
    shader_00.locs[4] = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    shader_00.locs[5] = (int)in_stack_fffffffffffffd50;
    shader_00.locs[6] = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    shader_00.locs[7] = (int)in_stack_fffffffffffffd58;
    shader_00.locs[8] = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    shader_00.locs[9] = (int)in_stack_fffffffffffffd60;
    shader_00.locs[10] = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    shader_00.locs[0xb] = (int)in_stack_fffffffffffffd68;
    shader_00.locs[0xc] = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    shader_00.locs[0xd] = (int)in_stack_fffffffffffffd70;
    shader_00.locs[0xe] = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    shader_00.locs[0xf] = (int)in_stack_fffffffffffffd78;
    shader_00.locs[0x10] = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    shader_00.locs[0x11] = (int)in_stack_fffffffffffffd80;
    shader_00.locs[0x12] = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    shader_00.locs[0x13] = (int)in_stack_fffffffffffffd88;
    shader_00.locs[0x14] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader_00.locs[0x15] = (int)in_stack_fffffffffffffd90;
    shader_00.locs[0x16] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader_00.locs[0x17] = (int)in_stack_fffffffffffffd98;
    shader_00.locs[0x18] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader_00.locs[0x19] = (int)in_stack_fffffffffffffda0;
    shader_00.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader_00.locs[0x1b] = (int)in_stack_fffffffffffffda8;
    shader_00.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader_00.locs[0x1d] = (int)in_stack_fffffffffffffdb0;
    shader_00.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader_00.locs[0x1f] = material.shader.locs[0x1d];
    in_stack_fffffffffffffdb8 = material.shader.locs[0x1d];
    rf_gfx_set_shader_value_matrix(shader_00,material.shader.locs[6],(rf__ctx->field_0).modelview);
  }
  if (material.shader.locs[7] != -1) {
    puVar35 = (undefined8 *)&stack0xfffffffffffffd38;
    for (lVar32 = 0x10; lVar32 != 0; lVar32 = lVar32 + -1) {
      *puVar35 = *ppuVar34;
      ppuVar34 = ppuVar34 + (ulong)bVar36 * -2 + 1;
      puVar35 = puVar35 + (ulong)bVar36 * -2 + 1;
    }
    shader_01.locs[1] = (int)in_stack_fffffffffffffd40;
    shader_01.locs[2] = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
    shader_01.id = (int)in_stack_fffffffffffffd38;
    shader_01.locs[0] = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    shader_01.locs[3] = (int)in_stack_fffffffffffffd48;
    shader_01.locs[4] = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    shader_01.locs[5] = (int)in_stack_fffffffffffffd50;
    shader_01.locs[6] = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
    shader_01.locs[7] = (int)in_stack_fffffffffffffd58;
    shader_01.locs[8] = (int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    shader_01.locs[9] = (int)in_stack_fffffffffffffd60;
    shader_01.locs[10] = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    shader_01.locs[0xb] = (int)in_stack_fffffffffffffd68;
    shader_01.locs[0xc] = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    shader_01.locs[0xd] = (int)in_stack_fffffffffffffd70;
    shader_01.locs[0xe] = (int)((ulong)in_stack_fffffffffffffd70 >> 0x20);
    shader_01.locs[0xf] = (int)in_stack_fffffffffffffd78;
    shader_01.locs[0x10] = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    shader_01.locs[0x11] = (int)in_stack_fffffffffffffd80;
    shader_01.locs[0x12] = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    shader_01.locs[0x13] = (int)in_stack_fffffffffffffd88;
    shader_01.locs[0x14] = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    shader_01.locs[0x15] = (int)in_stack_fffffffffffffd90;
    shader_01.locs[0x16] = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    shader_01.locs[0x17] = (int)in_stack_fffffffffffffd98;
    shader_01.locs[0x18] = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    shader_01.locs[0x19] = (int)in_stack_fffffffffffffda0;
    shader_01.locs[0x1a] = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
    shader_01.locs[0x1b] = (int)in_stack_fffffffffffffda8;
    shader_01.locs[0x1c] = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    shader_01.locs[0x1d] = (int)in_stack_fffffffffffffdb0;
    shader_01.locs[0x1e] = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    shader_01.locs[0x1f] = material.shader.locs[0x1d];
    rf_gfx_set_shader_value_matrix(shader_01,material.shader.locs[7],(rf__ctx->field_0).projection);
    in_stack_fffffffffffffdb8 = material.shader.locs[0x1d];
  }
  memcpy(&mat_projection.m11,&(rf__ctx->field_0).modelview,0x40);
  memcpy(&mat_model_view.m11,&(rf__ctx->field_0).projection,0x40);
  uVar3 = (rf__ctx->field_0).transform.m8;
  uVar4 = (rf__ctx->field_0).transform.m12;
  uVar5 = (rf__ctx->field_0).transform.m1;
  uVar6 = (rf__ctx->field_0).transform.m5;
  uVar7 = (rf__ctx->field_0).transform.m9;
  uVar8 = (rf__ctx->field_0).transform.m13;
  uVar9 = (rf__ctx->field_0).transform.m2;
  uVar10 = (rf__ctx->field_0).transform.m6;
  uVar11 = (rf__ctx->field_0).transform.m10;
  uVar12 = (rf__ctx->field_0).transform.m14;
  uVar13 = (rf__ctx->field_0).transform.m3;
  uVar14 = (rf__ctx->field_0).transform.m7;
  uVar15 = (rf__ctx->field_0).transform.m11;
  uVar16 = (rf__ctx->field_0).transform.m15;
  left.m7 = (float)uVar16;
  left.m3 = (float)uVar15;
  left.m14 = (float)uVar14;
  left.m10 = (float)uVar13;
  left.m6 = (float)uVar12;
  left.m2 = (float)uVar11;
  left.m13 = (float)uVar10;
  left.m9 = (float)uVar9;
  left.m5 = (float)uVar8;
  left.m1 = (float)uVar7;
  left.m12 = (float)uVar6;
  left.m8 = (float)uVar5;
  left.m4 = (float)uVar4;
  left.m0 = (float)uVar3;
  left.m11 = mat_projection.m11;
  left.m15 = mat_projection.m15;
  right._8_8_ = mat_view._8_8_;
  right._0_8_ = mat_view._0_8_;
  right._16_8_ = mat_view._16_8_;
  right._24_8_ = mat_view._24_8_;
  right._32_8_ = mat_view._32_8_;
  right._40_8_ = mat_view._40_8_;
  right._48_8_ = mat_view._48_8_;
  right.m11 = (float)in_stack_fffffffffffffdb8;
  right.m15 = in_stack_fffffffffffffdbc;
  rf_mat_mul(left,right);
  auVar31 = rVar2._0_56_;
  rVar2._56_8_ = i;
  rVar2.m0 = (float)auVar31._0_4_;
  rVar2.m4 = (float)auVar31._4_4_;
  rVar2.m8 = (float)auVar31._8_4_;
  rVar2.m12 = (float)auVar31._12_4_;
  rVar2.m1 = (float)auVar31._16_4_;
  rVar2.m5 = (float)auVar31._20_4_;
  rVar2.m9 = (float)auVar31._24_4_;
  rVar2.m13 = (float)auVar31._28_4_;
  rVar2.m2 = (float)auVar31._32_4_;
  rVar2.m6 = (float)auVar31._36_4_;
  rVar2.m10 = (float)auVar31._40_4_;
  rVar2.m14 = (float)auVar31._44_4_;
  rVar2.m3 = (float)auVar31._48_4_;
  rVar2.m7 = (float)auVar31._52_4_;
  right_00._8_8_ = local_f8;
  right_00._0_8_ = uStack_100;
  right_00._16_8_ = uStack_f0;
  right_00._24_8_ = local_e8;
  right_00._32_8_ = uStack_e0;
  right_00._40_8_ = local_d8;
  right_00._48_8_ = uStack_d0;
  right_00.m11 = (float)in_stack_fffffffffffffdb8;
  right_00.m15 = in_stack_fffffffffffffdbc;
  rf_mat_mul(rVar2,right_00);
  mat_mvp.m11 = 0.0;
  mat_mvp.m15 = 0.0;
  for (; (long)mat_mvp._56_8_ < 0xc; mat_mvp._56_8_ = mat_mvp._56_8_ + 1) {
    if (*(int *)(material._128_8_ + mat_mvp._56_8_ * 0x20) != 0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)((int)mat_mvp.m11 + 0x84c0);
      if (((mat_mvp._56_8_ == 8) || (mat_mvp._56_8_ == 9)) || (mat_mvp._56_8_ == 7)) {
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)
                  (0x8513,*(uint *)(material._128_8_ + mat_mvp._56_8_ * 0x20));
      }
      else {
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)
                  (0xde1,*(uint *)(material._128_8_ + mat_mvp._56_8_ * 0x20));
      }
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1i)
                (material.shader.locs[mat_mvp._56_8_ + 0xc],(int)mat_mvp.m11);
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)((uint)mesh.bone_weights);
  memcpy(&(rf__ctx->field_0).modelview,local_c8,0x40);
  uVar37._0_4_ = (rf__ctx->field_0).projection.m0;
  uVar37._4_4_ = (rf__ctx->field_0).projection.m4;
  uVar17 = (rf__ctx->field_0).projection.m8;
  uVar18 = (rf__ctx->field_0).projection.m12;
  uVar19 = (rf__ctx->field_0).projection.m1;
  uVar20 = (rf__ctx->field_0).projection.m5;
  uVar21 = (rf__ctx->field_0).projection.m9;
  uVar22 = (rf__ctx->field_0).projection.m13;
  uVar23 = (rf__ctx->field_0).projection.m2;
  uVar24 = (rf__ctx->field_0).projection.m6;
  uVar25 = (rf__ctx->field_0).projection.m10;
  uVar26 = (rf__ctx->field_0).projection.m14;
  uVar27 = (rf__ctx->field_0).projection.m3;
  uVar28 = (rf__ctx->field_0).projection.m7;
  uVar29 = (rf__ctx->field_0).projection.m11;
  uVar30 = (rf__ctx->field_0).projection.m15;
  right_01.m7 = (float)uVar30;
  right_01.m3 = (float)uVar29;
  right_01.m14 = (float)uVar28;
  right_01.m10 = (float)uVar27;
  right_01.m6 = (float)uVar26;
  right_01.m2 = (float)uVar25;
  right_01.m13 = (float)uVar24;
  right_01.m9 = (float)uVar23;
  right_01.m5 = (float)uVar22;
  right_01.m1 = (float)uVar21;
  right_01.m12 = (float)uVar20;
  right_01.m8 = (float)uVar19;
  right_01.m4 = (float)uVar18;
  right_01.m0 = (float)uVar17;
  right_01.m11 = (float)in_stack_fffffffffffffdb8;
  right_01.m15 = in_stack_fffffffffffffdbc;
  rf_mat_mul(*(rf_mat *)&(rf__ctx->field_0).modelview.m8,right_01);
  p_Var1 = (rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv;
  mat.m8 = mat_mvp.m8;
  mat.m12 = mat_mvp.m12;
  mat.m0 = mat_mvp.m0;
  mat.m4 = mat_mvp.m4;
  mat.m1 = mat_mvp.m1;
  mat.m5 = mat_mvp.m5;
  mat.m9 = mat_mvp.m9;
  mat.m13 = mat_mvp.m13;
  mat.m2 = mat_mvp.m2;
  mat.m6 = mat_mvp.m6;
  mat.m10 = mat_mvp.m10;
  mat.m14 = mat_mvp.m14;
  mat.m3 = mat_mvp.m3;
  mat.m7 = mat_mvp.m7;
  mat.m11 = (float)(int)uVar37;
  mat.m15 = (float)(int)((ulong)uVar37 >> 0x20);
  rf_mat_to_float16(mat);
  (*p_Var1)(material.shader.locs[4],1,'\0',(float *)&i_1);
  if (mesh.colors == (uchar *)0x0) {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawArrays)(4,0,in_stack_00000008);
  }
  else {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawElements)(4,in_stack_0000000c * 3,0x1403,(void *)0x0);
  }
  for (local_198 = 0; local_198 < 0xc; local_198 = local_198 + 1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)((int)local_198 + 0x84c0);
    if (((local_198 == 8) || (local_198 == 9)) || (local_198 == 7)) {
      (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,0);
    }
    else {
      (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
    }
  }
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(0);
  memcpy(&(rf__ctx->field_0).projection,&mat_model_view.m11,0x40);
  memcpy(&(rf__ctx->field_0).modelview,&mat_projection.m11,0x40);
  return;
}

Assistant:

RF_API void rf_gfx_draw_mesh(rf_mesh mesh, rf_material material, rf_mat transform)
{
    // Bind shader program
    rf_gl.UseProgram(material.shader.id);

    // Matrices and other values required by shader
    //-----------------------------------------------------
    // Calculate and send to shader model matrix (used by PBR shader)
    if (material.shader.locs[RF_LOC_MATRIX_MODEL] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_MODEL], transform);

    // Upload to shader material.col_diffuse
    if (material.shader.locs[RF_LOC_COLOR_DIFFUSE] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_DIFFUSE], (float)material.maps[RF_MAP_DIFFUSE].color.r / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.g / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.b / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.a / 255.0f);

    // Upload to shader material.colSpecular (if available)
    if (material.shader.locs[RF_LOC_COLOR_SPECULAR] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_SPECULAR], (float)material.maps[RF_MAP_SPECULAR].color.r / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.g / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.b / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.a / 255.0f);

    if (material.shader.locs[RF_LOC_MATRIX_VIEW] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_VIEW],
                                       rf_ctx.modelview);
    if (material.shader.locs[RF_LOC_MATRIX_PROJECTION] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_PROJECTION],
                                       rf_ctx.projection);

    // At this point the rf_ctx->gl_ctx.modelview matrix just contains the view matrix (camera)
    // That's because rf_begin_mode3d() sets it an no model-drawing function modifies it, all use rf_gfx_push_matrix() and rf_gfx_pop_matrix()
    rf_mat mat_view = rf_ctx.modelview;         // View matrix (camera)
    rf_mat mat_projection = rf_ctx.projection;  // Projection matrix (perspective)

    // TODO: Consider possible transform matrices in the rf_ctx->gl_ctx.stack
    // Is this the right order? or should we start with the first stored matrix instead of the last one?
    //rf_mat matStackTransform = rf_mat_identity();
    //for (rf_int i = rf_ctx->gl_ctx.stack_counter; i > 0; i--) matStackTransform = rf_mat_mul(rf_ctx->gl_ctx.stack[i], matStackTransform);

    // rf_transform to camera-space coordinates
    rf_mat mat_model_view = rf_mat_mul(transform, rf_mat_mul(rf_ctx.transform, mat_view));
    //-----------------------------------------------------

    // Bind active texture maps (if available)
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        if (material.maps[i].texture.id > 0)
        {
            rf_gl.ActiveTexture(GL_TEXTURE0 + i);
            if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, material.maps[i].texture.id);
            else rf_gl.BindTexture(GL_TEXTURE_2D, material.maps[i].texture.id);

            rf_gl.Uniform1i(material.shader.locs[RF_LOC_MAP_DIFFUSE + i], i);
        }
    }

    // Bind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(mesh.vao_id);

    rf_ctx.modelview = mat_model_view;

    // Calculate model-view-rf_ctx->gl_ctx.projection matrix (MVP)
    rf_mat mat_mvp = rf_mat_mul(rf_ctx.modelview, rf_ctx.projection); // rf_transform to screen-space coordinates

    // Send combined model-view-rf_ctx->gl_ctx.projection matrix to shader
    rf_gl.UniformMatrix4fv(material.shader.locs[RF_LOC_MATRIX_MVP], 1, false, rf_mat_to_float16(mat_mvp).v);

    // Draw call!
    if (mesh.indices != NULL) rf_gl.DrawElements(GL_TRIANGLES, mesh.triangle_count * 3, GL_UNSIGNED_SHORT, 0); // Indexed vertices draw
    else rf_gl.DrawArrays(GL_TRIANGLES, 0, mesh.vertex_count);

    // Unbind all binded texture maps
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        rf_gl.ActiveTexture(GL_TEXTURE0 + i);       // Set shader active texture
        if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, 0);
        else rf_gl.BindTexture(GL_TEXTURE_2D, 0);   // Unbind current active texture
    }

    // Unind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(0);

    // Unbind shader program
    rf_gl.UseProgram(0);

    // Restore rf_ctx->gl_ctx.projection/rf_ctx->gl_ctx.modelview matrices
    // NOTE: In stereo rendering matrices are being modified to fit every eye
    rf_ctx.projection = mat_projection;
    rf_ctx.modelview = mat_view;
}